

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_13be9a::HamtRoundTrip::HamtRoundTrip(HamtRoundTrip *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HamtRoundTrip_00257590;
  in_memory_store::in_memory_store(&this->store_);
  pstore::database::database<pstore::file::in_memory>(&this->db_,&(this->store_).file_,true);
  return;
}

Assistant:

HamtRoundTrip ()
                : db_{store_.file ()} {}